

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void * canvas_undo_set_arrange(_glist *x,t_gobj *obj,int newindex)

{
  t_selection *ptVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  t_gobj *ptVar5;
  
  if ((x->field_0xe8 & 0x20) == 0) {
    canvas_editmode(x,1.0);
  }
  if (x->gl_editor != (t_editor *)0x0) {
    ptVar1 = x->gl_editor->e_selection;
    while( true ) {
      if (ptVar1 == (t_selection *)0x0) break;
      if (ptVar1->sel_what == obj) {
        if (ptVar1 != (t_selection *)0x0) goto LAB_0013c688;
        break;
      }
      ptVar1 = ptVar1->sel_next;
    }
  }
  glist_select(x,obj);
LAB_0013c688:
  piVar2 = (int *)getbytes(8);
  iVar3 = 0;
  iVar4 = 0;
  if (newindex != 0) {
    iVar4 = -1;
    for (ptVar5 = x->gl_list; ptVar5 != (t_gobj *)0x0; ptVar5 = ptVar5->g_next) {
      iVar4 = iVar4 + 1;
    }
  }
  piVar2[1] = iVar4;
  ptVar5 = x->gl_list;
  if (ptVar5 != obj && ptVar5 != (t_gobj *)0x0) {
    iVar3 = 0;
    do {
      iVar3 = iVar3 + 1;
      ptVar5 = ptVar5->g_next;
      if (ptVar5 == (_gobj *)0x0) break;
    } while (ptVar5 != obj);
  }
  *piVar2 = iVar3;
  return piVar2;
}

Assistant:

void *canvas_undo_set_arrange(t_canvas *x, t_gobj *obj, int newindex)
{
        /* newindex tells us is the new index at the beginning (0) or the end (1) */

    t_undo_arrange *buf;
        /* enable editor (in case it is disabled) and select the object
           we are working on */
    if (!x->gl_edit)
        canvas_editmode(x, 1);

        /* select the object*/
    if (!glist_isselected(x, obj))
        glist_select(x, obj);

    buf = (t_undo_arrange *)getbytes(sizeof(*buf));

        /* set the u_newindex appropriately */
    if (newindex == 0) buf->u_newindex = 0;
    else buf->u_newindex = glist_getindex(x, 0) - 1;

        /* store index of the currently selected object */
    buf->u_previndex = glist_getindex(x, obj);

    return (buf);
}